

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

QThread * __thiscall QNetworkAccessManagerPrivate::createThread(QNetworkAccessManagerPrivate *this)

{
  long lVar1;
  QThread *pQVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->thread;
  if (pQVar2 == (QThread *)0x0) {
    pQVar2 = (QThread *)operator_new(0x10);
    QThread::QThread(pQVar2,(QObject *)0x0);
    this->thread = pQVar2;
    QObject::doSetObjectName((QString *)pQVar2);
    QThread::start(this->thread,7);
    pQVar2 = this->thread;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QThread * QNetworkAccessManagerPrivate::createThread()
{
    if (!thread) {
        thread = new QThread;
        thread->setObjectName(QStringLiteral("QNetworkAccessManager thread"));
        thread->start();
    }
    Q_ASSERT(thread);
    return thread;
}